

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O3

void __thiscall
BasicContainer::build
          (BasicContainer *this,vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> *list,
          treenode **cur)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  BasicPrimitive *pBVar7;
  bool bVar8;
  float fVar9;
  BasicContainer *this_00;
  treenode **pptVar10;
  treenode *ptVar11;
  ulong uVar12;
  pointer ppBVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  __last;
  code *pcVar19;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  _Var20;
  _Iter_comp_iter<bool_(*)(BasicPrimitive_*,_BasicPrimitive_*)> __comp;
  __normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
  _Var21;
  long lVar22;
  float fVar23;
  double dVar24;
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar33;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  vector<float,_std::allocator<float>_> prefix_area;
  vector<float,_std::allocator<float>_> suffix_area;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  undefined8 local_a8;
  BasicContainer *local_a0;
  vector<float,_std::allocator<float>_> local_98;
  treenode **local_80;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_78;
  vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_> local_60;
  double local_48;
  double dStack_40;
  
  ptVar11 = *cur;
  if (ptVar11 == (treenode *)0x0) {
    ptVar11 = (treenode *)operator_new(0x30);
    ptVar11->lc = (treenode *)0x0;
    ptVar11->rc = (treenode *)0x0;
    ptVar11->shape = (BasicPrimitive *)0x0;
    (ptVar11->bound).x1 = 0.0;
    (ptVar11->bound).x2 = 0.0;
    (ptVar11->bound).y1 = 0.0;
    (ptVar11->bound).y2 = 0.0;
    (ptVar11->bound).z1 = 0.0;
    (ptVar11->bound).z2 = 0.0;
    *cur = ptVar11;
  }
  ppBVar13 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl
             .super__Vector_impl_data._M_start;
  if ((long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)ppBVar13 == 8) {
    pBVar7 = *ppBVar13;
    ptVar11->shape = pBVar7;
    (*(pBVar7->super_Primitive)._vptr_Primitive[1])(local_b8);
    ptVar11 = *cur;
    *(pointer *)&(ptVar11->bound).z1 = local_a8;
    (ptVar11->bound).x1 = (float)local_b8._0_4_;
    (ptVar11->bound).x2 = (float)local_b8._4_4_;
    *(pointer *)&(ptVar11->bound).y1 = uStack_b0;
  }
  else {
    local_a0 = this;
    local_80 = cur;
    (*((*ppBVar13)->super_Primitive)._vptr_Primitive[1])(local_b8);
    *(pointer *)&(ptVar11->bound).z1 = local_a8;
    (ptVar11->bound).x1 = (float)local_b8._0_4_;
    (ptVar11->bound).x2 = (float)local_b8._4_4_;
    *(pointer *)&(ptVar11->bound).y1 = uStack_b0;
    _Var21._M_current =
         (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    uVar12 = (long)__last._M_current - (long)_Var21._M_current >> 3;
    if (1 < uVar12) {
      uVar18 = 1;
      do {
        (*(_Var21._M_current[uVar18]->super_Primitive)._vptr_Primitive[1])(local_b8);
        fVar23 = (ptVar11->bound).x1;
        fVar26 = (ptVar11->bound).x2;
        fVar28 = (float)local_b8._0_4_;
        if (fVar23 <= (float)local_b8._0_4_) {
          fVar28 = fVar23;
        }
        fVar37 = (float)local_b8._4_4_;
        if ((float)local_b8._4_4_ <= fVar26) {
          fVar37 = fVar26;
        }
        fVar33 = (ptVar11->bound).y1;
        fVar1 = (float)uStack_b0;
        if (fVar33 <= (float)uStack_b0) {
          fVar1 = fVar33;
        }
        fVar2 = (ptVar11->bound).y2;
        fVar3 = uStack_b0._4_4_;
        if (uStack_b0._4_4_ <= fVar2) {
          fVar3 = fVar2;
        }
        fVar4 = (ptVar11->bound).z1;
        fVar5 = (float)local_a8;
        if (fVar4 <= (float)local_a8) {
          fVar5 = fVar4;
        }
        fVar6 = (ptVar11->bound).z2;
        fVar9 = local_a8._4_4_;
        if (local_a8._4_4_ <= fVar6) {
          fVar9 = fVar6;
        }
        (ptVar11->bound).x1 =
             (float)(~-(uint)NAN(fVar23) & (uint)fVar28 | -(uint)NAN(fVar23) & local_b8._0_4_);
        (ptVar11->bound).x2 =
             (float)(~-(uint)NAN(fVar26) & (uint)fVar37 | -(uint)NAN(fVar26) & local_b8._4_4_);
        (ptVar11->bound).y1 =
             (float)(~-(uint)NAN(fVar33) & (uint)fVar1 | -(uint)NAN(fVar33) & (uint)(float)uStack_b0
                    );
        (ptVar11->bound).y2 =
             (float)(~-(uint)NAN(fVar2) & (uint)fVar3 | -(uint)NAN(fVar2) & (uint)uStack_b0._4_4_);
        (ptVar11->bound).z1 =
             (float)(~-(uint)NAN(fVar4) & (uint)fVar5 | -(uint)NAN(fVar4) & (uint)(float)local_a8);
        (ptVar11->bound).z2 =
             (float)(~-(uint)NAN(fVar6) & (uint)fVar9 | -(uint)NAN(fVar6) & (uint)local_a8._4_4_);
        uVar18 = uVar18 + 1;
        _Var21._M_current =
             (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl
             .super__Vector_impl_data._M_start;
        __last._M_current =
             (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl
             .super__Vector_impl_data._M_finish;
        uVar12 = (long)__last._M_current - (long)_Var21._M_current >> 3;
      } while (uVar18 < uVar12);
    }
    _Var20._M_current = __last._M_current;
    if (_Var21._M_current != __last._M_current) {
      fVar23 = (ptVar11->bound).z2 - (ptVar11->bound).z1;
      fVar26 = (ptVar11->bound).x2 - (ptVar11->bound).x1;
      fVar28 = (ptVar11->bound).y2 - (ptVar11->bound).y1;
      pcVar19 = build::anon_class_1_0_00000001::__invoke;
      if (fVar26 < fVar28) {
        pcVar19 = build::anon_class_1_0_00000001::__invoke;
      }
      __comp._M_comp = build::anon_class_1_0_00000001::__invoke;
      if (fVar23 <= fVar26 || fVar23 <= fVar28) {
        __comp._M_comp = pcVar19;
      }
      lVar15 = 0x3f;
      if (uVar12 != 0) {
        for (; uVar12 >> lVar15 == 0; lVar15 = lVar15 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(BasicPrimitive*,BasicPrimitive*)>>
                (_Var21,__last,(ulong)(((uint)lVar15 ^ 0x3f) * 2) ^ 0x7e,__comp);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(BasicPrimitive*,BasicPrimitive*)>>
                (_Var21,__last,__comp);
      __last._M_current =
           (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
           super__Vector_impl_data._M_start;
      _Var20._M_current =
           (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
           super__Vector_impl_data._M_finish;
    }
    local_b8 = (undefined1  [8])0x0;
    uStack_b0 = (pointer)0x0;
    local_a8 = (pointer)0x0;
    local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<float,_std::allocator<float>_>::resize
              ((vector<float,_std::allocator<float>_> *)local_b8,
               (long)_Var20._M_current - (long)__last._M_current >> 3);
    std::vector<float,_std::allocator<float>_>::resize
              (&local_98,
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
    (*((*(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start)->super_Primitive)._vptr_Primitive[1])(&local_f8);
    pptVar10 = local_80;
    ppBVar13 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    if ((list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
        super__Vector_impl_data._M_finish == ppBVar13) {
      lVar15 = 0;
    }
    else {
      uVar12 = 0;
      do {
        (*(ppBVar13[uVar12]->super_Primitive)._vptr_Primitive[1])(&local_d8);
        fVar26 = fStack_f0;
        fVar28 = fStack_ec;
        fVar23 = fStack_d0;
        if (fStack_f0 <= fStack_d0) {
          fVar23 = fStack_f0;
        }
        fVar37 = (float)(~-(uint)NAN(fStack_f0) & (uint)fVar23 |
                        -(uint)NAN(fStack_f0) & (uint)fStack_d0);
        fVar23 = fStack_cc;
        if (fStack_cc <= fStack_ec) {
          fVar23 = fStack_ec;
        }
        fVar23 = (float)(~-(uint)NAN(fStack_ec) & (uint)fVar23 |
                        -(uint)NAN(fStack_ec) & (uint)fStack_cc);
        _fStack_f0 = CONCAT44(fVar23,fVar37);
        fVar23 = fVar23 - fVar37;
        auVar31._4_4_ = local_e8;
        auVar31._0_4_ = local_f8;
        auVar31._8_4_ = fVar26;
        auVar31._12_4_ = fVar28;
        auVar34._4_4_ = local_c8;
        auVar34._0_4_ = local_d8;
        auVar34._8_4_ = fStack_d0;
        auVar34._12_4_ = fStack_cc;
        auVar35 = minps(auVar34,auVar31);
        fVar37 = (float)(~-(uint)NAN(local_f8) & auVar35._0_4_ |
                        (uint)local_d8 & -(uint)NAN(local_f8));
        fVar33 = (float)(~-(uint)NAN(local_e8) & auVar35._4_4_ |
                        (uint)local_c8 & -(uint)NAN(local_e8));
        auVar35._4_4_ = fStack_e4;
        auVar35._0_4_ = fStack_f4;
        auVar35._8_4_ = fVar28;
        auVar35._12_4_ = local_e8;
        auVar29._4_4_ = fStack_c4;
        auVar29._0_4_ = fStack_d4;
        auVar29._8_4_ = fStack_cc;
        auVar29._12_4_ = local_c8;
        auVar35 = maxps(auVar29,auVar35);
        fVar26 = (float)(~-(uint)NAN(fStack_f4) & auVar35._0_4_ |
                        (uint)fStack_d4 & -(uint)NAN(fStack_f4));
        fVar28 = (float)(~-(uint)NAN(fStack_e4) & auVar35._4_4_ |
                        (uint)fStack_c4 & -(uint)NAN(fStack_e4));
        _local_f8 = CONCAT44(fVar26,fVar37);
        _local_e8 = CONCAT44(fVar28,fVar33);
        fVar26 = fVar26 - fVar37;
        fVar28 = fVar28 - fVar33;
        fVar23 = fVar28 * fVar23 + fVar26 * fVar23 + fVar26 * fVar28;
        *(float *)((long)local_b8 + uVar12 * 4) = fVar23 + fVar23;
        uVar12 = uVar12 + 1;
        ppBVar13 = (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        lVar15 = (long)(list->
                       super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppBVar13;
      } while (uVar12 < (ulong)(lVar15 >> 3));
    }
    (**(code **)(**(long **)((long)ppBVar13 + lVar15 + -8) + 8))(&local_d8);
    fStack_e4 = fStack_c4;
    local_f8 = local_d8;
    fStack_f4 = fStack_d4;
    _Var21._M_current =
         (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
    uVar12 = (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)_Var21._M_current;
    uVar14 = (int)(uVar12 >> 3) - 1;
    fStack_f0 = fStack_d0;
    fStack_ec = fStack_cc;
    local_e8 = local_c8;
    if (-1 < (int)uVar14) {
      lVar15 = (ulong)uVar14 + 1;
      do {
        (*((list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
           super__Vector_impl_data._M_start[lVar15 + -1]->super_Primitive)._vptr_Primitive[1])
                  (&local_d8);
        fVar23 = fStack_d0;
        if (fStack_f0 <= fStack_d0) {
          fVar23 = fStack_f0;
        }
        fVar26 = (float)(~-(uint)NAN(fStack_f0) & (uint)fVar23 |
                        -(uint)NAN(fStack_f0) & (uint)fStack_d0);
        fVar23 = fStack_cc;
        if (fStack_cc <= fStack_ec) {
          fVar23 = fStack_ec;
        }
        fVar23 = (float)(~-(uint)NAN(fStack_ec) & (uint)fVar23 |
                        -(uint)NAN(fStack_ec) & (uint)fStack_cc);
        auVar32._4_4_ = local_e8;
        auVar32._0_4_ = local_f8;
        auVar32._8_4_ = fStack_f0;
        auVar32._12_4_ = fStack_ec;
        auVar36._4_4_ = local_c8;
        auVar36._0_4_ = local_d8;
        auVar36._8_4_ = fStack_d0;
        auVar36._12_4_ = fStack_cc;
        auVar35 = minps(auVar36,auVar32);
        local_f8 = (float)(~-(uint)NAN(local_f8) & auVar35._0_4_ |
                          (uint)local_d8 & -(uint)NAN(local_f8));
        fVar37 = (float)(~-(uint)NAN(local_e8) & auVar35._4_4_ |
                        (uint)local_c8 & -(uint)NAN(local_e8));
        auVar27._4_4_ = fStack_e4;
        auVar27._0_4_ = fStack_f4;
        auVar27._8_4_ = fStack_ec;
        auVar27._12_4_ = local_e8;
        auVar30._4_4_ = fStack_c4;
        auVar30._0_4_ = fStack_d4;
        auVar30._8_4_ = fStack_cc;
        auVar30._12_4_ = local_c8;
        auVar35 = maxps(auVar30,auVar27);
        fStack_f4 = (float)(~-(uint)NAN(fStack_f4) & auVar35._0_4_ |
                           (uint)fStack_d4 & -(uint)NAN(fStack_f4));
        fStack_e4 = (float)(~-(uint)NAN(fStack_e4) & auVar35._4_4_ |
                           (uint)fStack_c4 & -(uint)NAN(fStack_e4));
        fVar28 = (fStack_e4 - fVar37) * (fVar23 - fVar26) +
                 (fStack_f4 - local_f8) * (fVar23 - fVar26) +
                 (fStack_f4 - local_f8) * (fStack_e4 - fVar37);
        local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar15 + -1] = fVar28 + fVar28;
        lVar22 = lVar15 + -1;
        bVar8 = 0 < lVar15;
        lVar15 = lVar22;
        fStack_f0 = fVar26;
        fStack_ec = fVar23;
        local_e8 = fVar37;
      } while (lVar22 != 0 && bVar8);
      _Var21._M_current =
           (list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)._M_impl.
           super__Vector_impl_data._M_start;
      uVar12 = (long)(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>)
                     ._M_impl.super__Vector_impl_data._M_finish - (long)_Var21._M_current;
    }
    auVar25._8_4_ = (int)((long)uVar12 >> 0x23);
    auVar25._0_8_ = (long)uVar12 >> 3;
    auVar25._12_4_ = 0x45300000;
    dStack_40 = auVar25._8_8_ - 1.9342813113834067e+25;
    local_48 = dStack_40 +
               ((double)CONCAT44(0x43300000,(int)((long)uVar12 >> 3)) - 4503599627370496.0);
    dVar24 = round(local_48 * 0.15);
    iVar16 = (int)dVar24;
    dVar24 = round(local_48 * 0.85);
    this_00 = local_a0;
    iVar17 = iVar16;
    if (iVar16 < (int)(dVar24 + -1.0)) {
      lVar15 = (long)iVar16;
      lVar22 = 0;
      do {
        if (*(float *)((long)local_b8 + (lVar15 + lVar22) * 4) +
            local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar15 + lVar22 + 1] <
            *(float *)((long)local_b8 + (long)iVar17 * 4) +
            local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[(long)iVar17 + 1]) {
          iVar17 = iVar16 + (int)lVar22;
        }
        lVar22 = lVar22 + 1;
      } while ((int)(dVar24 + -1.0) - lVar15 != lVar22);
    }
    std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
    vector<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,void>
              ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&local_60,_Var21,
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )(_Var21._M_current + (long)iVar17 + 1),(allocator_type *)&local_d8);
    build(this_00,&local_60,&(*pptVar10)->lc);
    if (local_60.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.
                      super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>::
    vector<__gnu_cxx::__normal_iterator<BasicPrimitive**,std::vector<BasicPrimitive*,std::allocator<BasicPrimitive*>>>,void>
              ((vector<BasicPrimitive*,std::allocator<BasicPrimitive*>> *)&local_78,
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )((list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                  _M_impl.super__Vector_impl_data._M_start + (long)iVar17 + 1),
               (__normal_iterator<BasicPrimitive_**,_std::vector<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>_>
                )(list->super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_d8);
    build(this_00,&local_78,&(*pptVar10)->rc);
    if (local_78.super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<BasicPrimitive_*,_std::allocator<BasicPrimitive_*>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_b8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_b8);
    }
  }
  return;
}

Assistant:

void build(std::vector<BasicPrimitive*> list, treenode*& cur)
	{
		// create tree node
		if (!cur) {
			cur = new treenode();
		}
		// bind shape to leaf nodes
		if (list.size() == 1)
		{
			cur->shape = list[0];
			cur->bound = list[0]->boundingVolume();
			return;
		}
		// compute bounding box
		AABox& bound = cur->bound;
		bound = list[0]->boundingVolume();
		for (int i=1; i<list.size(); ++i) {
			bound = bound + list[i]->boundingVolume();
		}
		// sort in sparsest dimension
		auto cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
			return a->boundingVolume().x1 < b->boundingVolume().x1;
		};
		if (bound.y2 - bound.y1 > bound.x2 - bound.x1) {
			cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
				return a->boundingVolume().y1 < b->boundingVolume().y1;
			};
		}
		if (bound.z2 - bound.z1 > bound.x2 - bound.x1 &&
			bound.z2 - bound.z1 > bound.y2 - bound.y1) {
			cmp = +[](BasicPrimitive* a, BasicPrimitive* b) {
				return a->boundingVolume().z1 < b->boundingVolume().z1;
			};
		}
		std::sort(list.begin(), list.end(), cmp);
		// determine split position to minimize sum of surface area of bounding boxes
		std::vector<float> prefix_area, suffix_area;
		prefix_area.resize(list.size());
		suffix_area.resize(list.size());
		AABox accu = list[0]->boundingVolume();
		for (int i=0; i<list.size(); ++i) {
			accu = accu + list[i]->boundingVolume();
			prefix_area[i] = accu.surfaceArea();
		}
		accu = list[list.size()-1]->boundingVolume();
		for (int i=list.size()-1; i>=0; --i) {
			accu = accu + list[i]->boundingVolume();
			suffix_area[i] = accu.surfaceArea();
		}
		int rangemin = round(list.size()*0.15);
		int rangemax = round(list.size()*0.85)-1;
		// limit split point from being too close to side
		int best = rangemin;
		for (int i=rangemin; i<rangemax; ++i) {
			if (prefix_area[i] + suffix_area[i+1] < prefix_area[best] + suffix_area[best+1])
				best = i;
		}
		// recursive partition
		build(std::vector<BasicPrimitive*>(list.begin(), list.begin()+best+1), cur->lc);
		build(std::vector<BasicPrimitive*>(list.begin()+best+1, list.end()), cur->rc);
	}